

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedBinaryCover()::__0,true>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  double *pdVar5;
  char cVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint *puVar11;
  int *piVar12;
  ulong uVar13;
  uchar uVar14;
  long lVar15;
  ulong uVar16;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:233:22)>
  __cmp;
  _DistanceType __len;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var17;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  int *piVar23;
  double dVar24;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1c8;
  int local_1bc;
  int *local_1b8;
  long local_1b0;
  long local_1a8;
  byte local_101;
  uchar local_100 [72];
  uchar offsets_l_storage [128];
  
  local_1b8 = end._M_current + -1;
  local_1bc = bad_allowed;
LAB_002964ac:
  do {
    lVar8 = (long)end._M_current - (long)begin._M_current;
    uVar10 = lVar8 >> 2;
    if ((long)uVar10 < 0x18) {
      if ((leftmost & 1U) == 0) {
        if (begin._M_current != end._M_current) {
          while (piVar2 = begin._M_current + 1, piVar2 != end._M_current) {
            iVar3 = begin._M_current[1];
            lVar8 = (long)*begin._M_current;
            pdVar5 = (comp.this)->vals;
            dVar24 = pdVar5[iVar3];
            begin._M_current = piVar2;
            if (pdVar5[lVar8] <= dVar24 && dVar24 != pdVar5[lVar8]) {
              do {
                piVar23 = piVar2;
                *piVar23 = (int)lVar8;
                lVar8 = (long)piVar23[-2];
                piVar2 = piVar23 + -1;
              } while (pdVar5[lVar8] <= dVar24 && dVar24 != pdVar5[lVar8]);
              piVar23[-1] = iVar3;
            }
          }
        }
      }
      else if (begin._M_current != end._M_current) {
        lVar8 = 4;
        _Var17._M_current = begin._M_current;
        while (_Var17._M_current + 1 != end._M_current) {
          iVar3 = _Var17._M_current[1];
          lVar20 = (long)*_Var17._M_current;
          pdVar5 = (comp.this)->vals;
          dVar24 = pdVar5[iVar3];
          lVar15 = lVar8;
          if (pdVar5[lVar20] <= dVar24 && dVar24 != pdVar5[lVar20]) {
            do {
              *(int *)((long)begin._M_current + lVar15) = (int)lVar20;
              _Var19._M_current = begin._M_current;
              if (lVar15 == 4) goto LAB_00296daa;
              lVar20 = (long)*(begin._M_current + lVar15 + -8);
              lVar15 = lVar15 + -4;
            } while (pdVar5[lVar20] <= dVar24 && dVar24 != pdVar5[lVar20]);
            _Var19._M_current = lVar15 + begin._M_current;
LAB_00296daa:
            *_Var19._M_current = iVar3;
          }
          lVar8 = lVar8 + 4;
          _Var17._M_current = _Var17._M_current + 1;
        }
      }
      return;
    }
    uVar21 = uVar10 >> 1;
    _Var17._M_current = begin._M_current + uVar21;
    if (uVar10 < 0x81) {
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedBinaryCover()::__0>
                (_Var17,begin,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_1b8,comp);
    }
    else {
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedBinaryCover()::__0>
                (begin,_Var17,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_1b8,comp);
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedBinaryCover()::__0>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + 1),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + (uVar21 - 1)),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (end._M_current + -2),comp);
      _Var19._M_current = begin._M_current + uVar21 + 1;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedBinaryCover()::__0>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + 2),_Var19,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (end._M_current + -3),comp);
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedBinaryCover()::__0>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + (uVar21 - 1)),_Var17,_Var19,comp);
      iVar3 = *begin._M_current;
      *begin._M_current = _Var19._M_current[-1];
      _Var19._M_current[-1] = iVar3;
    }
    uVar4 = *begin._M_current;
    pdVar5 = (comp.this)->vals;
    if ((leftmost & 1U) == 0) {
      dVar24 = pdVar5[(int)uVar4];
      if (pdVar5[begin._M_current[-1]] <= dVar24) {
        lVar8 = 0;
        do {
          lVar15 = (long)*(end._M_current + lVar8 + -4);
          lVar8 = lVar8 + -4;
        } while (pdVar5[lVar15] <= dVar24 && dVar24 != pdVar5[lVar15]);
        puVar11 = (uint *)((long)end._M_current + lVar8);
        _Var17._M_current = begin._M_current;
        if (lVar8 == -4) {
          uVar10 = (ulong)uVar4;
          do {
            if (puVar11 <= _Var17._M_current) break;
            uVar10 = (ulong)(int)((uint *)_Var17._M_current)[1];
            _Var17._M_current = _Var17._M_current + 1;
          } while (dVar24 < pdVar5[uVar10] || dVar24 == pdVar5[uVar10]);
        }
        else {
          do {
            uVar10 = (ulong)(int)((uint *)_Var17._M_current)[1];
            _Var17._M_current = _Var17._M_current + 1;
          } while (dVar24 < pdVar5[uVar10] || dVar24 == pdVar5[uVar10]);
        }
        while (_Var17._M_current < puVar11) {
          *_Var17._M_current = (uint)lVar15;
          *puVar11 = (uint)uVar10;
          do {
            lVar15 = (long)(int)puVar11[-1];
            puVar11 = puVar11 + -1;
          } while (pdVar5[lVar15] <= dVar24 && dVar24 != pdVar5[lVar15]);
          do {
            uVar10 = (ulong)(int)((uint *)_Var17._M_current)[1];
            _Var17._M_current = _Var17._M_current + 1;
          } while (dVar24 < pdVar5[uVar10] || dVar24 == pdVar5[uVar10]);
        }
        *begin._M_current = (uint)lVar15;
        *puVar11 = uVar4;
        begin._M_current = (int *)(puVar11 + 1);
        goto LAB_002964ac;
      }
    }
    else {
      dVar24 = pdVar5[(int)uVar4];
    }
    lVar15 = 0;
    do {
      iVar3 = *(begin._M_current + lVar15 + 4);
      lVar15 = lVar15 + 4;
    } while (dVar24 < pdVar5[iVar3]);
    piVar2 = lVar15 + begin._M_current;
    _Var17._M_current = end._M_current;
    if (lVar15 == 4) {
      do {
        if (_Var17._M_current <= piVar2) break;
        piVar23 = _Var17._M_current + -1;
        _Var17._M_current = _Var17._M_current + -1;
      } while (pdVar5[*piVar23] <= dVar24);
    }
    else {
      do {
        piVar23 = _Var17._M_current + -1;
        _Var17._M_current = _Var17._M_current + -1;
      } while (pdVar5[*piVar23] <= dVar24);
    }
    _Var19._M_current = piVar2;
    if (piVar2 < _Var17._M_current) {
      _Var18._M_current = lVar15 + begin._M_current + 1;
      *(lVar15 + begin._M_current) = *_Var17._M_current;
      *_Var17._M_current = iVar3;
      uVar21 = 0;
      uVar22 = 0;
      local_1b0 = 0;
      local_1a8 = 0;
      _Var19._M_current = _Var18._M_current;
      piVar23 = _Var17._M_current;
      local_1c8._M_current = _Var17._M_current;
      while (_Var19._M_current < piVar23) {
        uVar9 = (long)piVar23 - (long)_Var19._M_current >> 2;
        uVar16 = uVar9 >> (uVar22 == 0);
        if (uVar21 != 0) {
          uVar16 = 0;
        }
        uVar9 = uVar9 - uVar16;
        if (uVar22 != 0) {
          uVar9 = 0;
        }
        piVar12 = _Var19._M_current;
        if (uVar16 < 0x40) {
          for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
            offsets_l_storage[uVar21 + 0x38] = (uchar)uVar13;
            dVar24 = (comp.this)->vals[*piVar12];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            uVar21 = uVar21 + (dVar24 < *pdVar5 || dVar24 == *pdVar5);
            piVar12 = piVar12 + 1;
          }
        }
        else {
          for (uVar16 = 0; uVar16 < 0x40; uVar16 = uVar16 + 8) {
            uVar14 = (uchar)uVar16;
            offsets_l_storage[uVar21 + 0x38] = uVar14;
            dVar24 = (comp.this)->vals[_Var19._M_current[uVar16]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            lVar15 = (dVar24 < *pdVar5 || dVar24 == *pdVar5) + uVar21;
            offsets_l_storage[lVar15 + 0x38] = uVar14 + '\x01';
            dVar24 = (comp.this)->vals[_Var19._M_current[uVar16 + 1]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            lVar15 = (ulong)(dVar24 < *pdVar5 || dVar24 == *pdVar5) + lVar15;
            offsets_l_storage[lVar15 + 0x38] = uVar14 + '\x02';
            dVar24 = (comp.this)->vals[_Var19._M_current[uVar16 + 2]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            lVar15 = (ulong)(dVar24 < *pdVar5 || dVar24 == *pdVar5) + lVar15;
            offsets_l_storage[lVar15 + 0x38] = uVar14 + '\x03';
            dVar24 = (comp.this)->vals[_Var19._M_current[uVar16 + 3]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            lVar15 = (ulong)(dVar24 < *pdVar5 || dVar24 == *pdVar5) + lVar15;
            offsets_l_storage[lVar15 + 0x38] = uVar14 + '\x04';
            dVar24 = (comp.this)->vals[_Var19._M_current[uVar16 + 4]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            lVar15 = (ulong)(dVar24 < *pdVar5 || dVar24 == *pdVar5) + lVar15;
            offsets_l_storage[lVar15 + 0x38] = uVar14 + '\x05';
            dVar24 = (comp.this)->vals[_Var19._M_current[uVar16 + 5]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            lVar15 = (ulong)(dVar24 < *pdVar5 || dVar24 == *pdVar5) + lVar15;
            offsets_l_storage[lVar15 + 0x38] = uVar14 + '\x06';
            dVar24 = (comp.this)->vals[_Var19._M_current[uVar16 + 6]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            lVar15 = (ulong)(dVar24 < *pdVar5 || dVar24 == *pdVar5) + lVar15;
            offsets_l_storage[lVar15 + 0x38] = uVar14 + '\a';
            dVar24 = (comp.this)->vals[_Var19._M_current[uVar16 + 7]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            uVar21 = (ulong)(dVar24 < *pdVar5 || dVar24 == *pdVar5) + lVar15;
            piVar12 = piVar12 + 8;
          }
        }
        if (uVar9 < 0x40) {
          uVar16 = 0;
          while (uVar9 != uVar16) {
            uVar16 = uVar16 + 1;
            local_100[uVar22] = (char)uVar16;
            piVar1 = piVar23 + -1;
            piVar23 = piVar23 + -1;
            dVar24 = (comp.this)->vals[*piVar1];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            uVar22 = uVar22 + (*pdVar5 <= dVar24 && dVar24 != *pdVar5);
          }
        }
        else {
          uVar9 = 0;
          while (uVar9 < 0x40) {
            cVar6 = (char)uVar9;
            local_100[uVar22] = cVar6 + '\x01';
            dVar24 = (comp.this)->vals[piVar23[-1]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            lVar15 = (*pdVar5 <= dVar24 && dVar24 != *pdVar5) + uVar22;
            local_100[lVar15] = cVar6 + '\x02';
            dVar24 = (comp.this)->vals[piVar23[-2]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            lVar15 = (ulong)(*pdVar5 <= dVar24 && dVar24 != *pdVar5) + lVar15;
            local_100[lVar15] = cVar6 + '\x03';
            dVar24 = (comp.this)->vals[piVar23[-3]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            lVar15 = (ulong)(*pdVar5 <= dVar24 && dVar24 != *pdVar5) + lVar15;
            local_100[lVar15] = cVar6 + '\x04';
            dVar24 = (comp.this)->vals[piVar23[-4]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            lVar15 = (ulong)(*pdVar5 <= dVar24 && dVar24 != *pdVar5) + lVar15;
            local_100[lVar15] = cVar6 + '\x05';
            dVar24 = (comp.this)->vals[piVar23[-5]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            lVar15 = (ulong)(*pdVar5 <= dVar24 && dVar24 != *pdVar5) + lVar15;
            local_100[lVar15] = cVar6 + '\x06';
            dVar24 = (comp.this)->vals[piVar23[-6]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            lVar15 = (ulong)(*pdVar5 <= dVar24 && dVar24 != *pdVar5) + lVar15;
            local_100[lVar15] = cVar6 + '\a';
            dVar24 = (comp.this)->vals[piVar23[-7]];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            lVar15 = (ulong)(*pdVar5 <= dVar24 && dVar24 != *pdVar5) + lVar15;
            uVar9 = uVar9 + 8;
            local_100[lVar15] = (char)uVar9;
            piVar1 = piVar23 + -8;
            piVar23 = piVar23 + -8;
            dVar24 = (comp.this)->vals[*piVar1];
            pdVar5 = (comp.this)->vals + (int)uVar4;
            uVar22 = (ulong)(*pdVar5 <= dVar24 && dVar24 != *pdVar5) + lVar15;
          }
        }
        uVar9 = uVar21;
        if (uVar22 < uVar21) {
          uVar9 = uVar22;
        }
        lVar15 = local_1a8 + 0x38;
        local_1a8 = local_1a8 + uVar9;
        _Var19._M_current = _Var18._M_current;
        if (uVar21 <= uVar22) {
          local_1a8 = 0;
          _Var19._M_current = piVar12;
        }
        swap_offsets<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (_Var18,local_1c8,offsets_l_storage + lVar15,local_100 + local_1b0,uVar9,
                   uVar21 == uVar22);
        uVar21 = uVar21 - uVar9;
        local_1b0 = local_1b0 + uVar9;
        uVar22 = uVar22 - uVar9;
        _Var18._M_current = _Var19._M_current;
        _Var19._M_current = piVar12;
        if (uVar22 == 0) {
          local_1b0 = 0;
          local_1c8._M_current = piVar23;
        }
      }
      if (uVar21 != 0) {
        while (_Var19._M_current = piVar23, uVar21 != 0) {
          iVar3 = _Var18._M_current[offsets_l_storage[uVar21 + local_1a8 + 0x37]];
          _Var18._M_current[offsets_l_storage[uVar21 + local_1a8 + 0x37]] = _Var19._M_current[-1];
          _Var19._M_current[-1] = iVar3;
          uVar21 = uVar21 - 1;
          piVar23 = _Var19._M_current + -1;
        }
      }
      if (uVar22 != 0) {
        while (uVar22 != 0) {
          iVar3 = local_1c8._M_current[-(ulong)(&local_101)[uVar22 + local_1b0]];
          local_1c8._M_current[-(ulong)(&local_101)[uVar22 + local_1b0]] = *_Var19._M_current;
          *_Var19._M_current = iVar3;
          _Var19._M_current = _Var19._M_current + 1;
          uVar22 = uVar22 - 1;
        }
      }
    }
    _Var18._M_current = _Var19._M_current + -1;
    *begin._M_current = _Var19._M_current[-1];
    _Var19._M_current[-1] = uVar4;
    uVar22 = (long)_Var18._M_current - (long)begin._M_current >> 2;
    uVar21 = (long)end._M_current - (long)_Var19._M_current >> 2;
    if (((long)uVar22 < (long)(uVar10 >> 3)) || ((long)uVar21 < (long)(uVar10 >> 3))) {
      local_1bc = local_1bc + -1;
      if (local_1bc == 0) {
        uVar21 = uVar10 - 2 >> 1;
        do {
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::separateLiftedMixedBinaryCover()::__0>>
                    (begin,uVar21,uVar10,begin._M_current[uVar21],
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:233:22)>
                      )comp.this);
          bVar7 = uVar21 != 0;
          uVar21 = uVar21 - 1;
        } while (bVar7);
        while (4 < lVar8) {
          iVar3 = *local_1b8;
          *local_1b8 = *begin._M_current;
          lVar8 = lVar8 + -4;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::separateLiftedMixedBinaryCover()::__0>>
                    (begin,0,lVar8 >> 2,iVar3,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:233:22)>
                      )comp.this);
          local_1b8 = local_1b8 + -1;
        }
        return;
      }
      if (0x17 < (long)uVar22) {
        iVar3 = *begin._M_current;
        uVar10 = uVar22 & 0xfffffffffffffffc;
        *begin._M_current = *(begin._M_current + uVar10);
        *(begin._M_current + uVar10) = iVar3;
        iVar3 = _Var19._M_current[-2];
        _Var19._M_current[-2] = *(_Var19._M_current + (-4 - uVar10));
        *(_Var19._M_current + (-4 - uVar10)) = iVar3;
        if (0x80 < uVar22) {
          uVar22 = uVar22 >> 2;
          iVar3 = begin._M_current[1];
          begin._M_current[1] = begin._M_current[uVar22 + 1];
          begin._M_current[uVar22 + 1] = iVar3;
          iVar3 = begin._M_current[2];
          begin._M_current[2] = begin._M_current[uVar22 + 2];
          begin._M_current[uVar22 + 2] = iVar3;
          iVar3 = _Var19._M_current[-3];
          _Var19._M_current[-3] = _Var19._M_current[~uVar22 - 1];
          _Var19._M_current[~uVar22 - 1] = iVar3;
          iVar3 = _Var19._M_current[-4];
          _Var19._M_current[-4] = _Var19._M_current[-uVar22 + -3];
          _Var19._M_current[-uVar22 + -3] = iVar3;
        }
      }
      if (0x17 < (long)uVar21) {
        uVar10 = uVar21 & 0xfffffffffffffffc;
        iVar3 = *_Var19._M_current;
        *_Var19._M_current = *(_Var19._M_current + uVar10);
        *(_Var19._M_current + uVar10) = iVar3;
        iVar3 = end._M_current[-1];
        end._M_current[-1] = *(end._M_current - uVar10);
        *(end._M_current - uVar10) = iVar3;
        if (0x80 < uVar21) {
          uVar21 = uVar21 >> 2;
          iVar3 = _Var19._M_current[1];
          _Var19._M_current[1] = _Var19._M_current[uVar21 + 1];
          _Var19._M_current[uVar21 + 1] = iVar3;
          iVar3 = _Var19._M_current[2];
          _Var19._M_current[2] = _Var19._M_current[uVar21 + 2];
          _Var19._M_current[uVar21 + 2] = iVar3;
          iVar3 = end._M_current[-2];
          end._M_current[-2] = end._M_current[~uVar21];
          end._M_current[~uVar21] = iVar3;
          iVar3 = end._M_current[-3];
          end._M_current[-3] = end._M_current[-2 - uVar21];
          end._M_current[-2 - uVar21] = iVar3;
        }
      }
    }
    else if (((_Var17._M_current <= piVar2) &&
             (bVar7 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedBinaryCover()::__0>
                                (begin,_Var18,comp), bVar7)) &&
            (bVar7 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedBinaryCover()::__0>
                               (_Var19,end,comp), bVar7)) {
      return;
    }
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedBinaryCover()::__0,true>
              (begin,_Var18,comp,local_1bc,(bool)(leftmost & 1));
    leftmost = false;
    begin._M_current = _Var19._M_current;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }